

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O0

longlong more_pthr(void)

{
  void *pvVar1;
  int local_70;
  uint time_end;
  int i_1;
  int i;
  longlong all_sum;
  thr_data *threadData;
  pthread_t threads [10];
  
  pvVar1 = operator_new__(0xa0);
  _i_1 = 0;
  for (time_end = 0; (int)time_end < 10; time_end = time_end + 1) {
    *(uint *)((long)pvVar1 + (long)(int)time_end * 0x10) = time_end + 1;
    *(undefined8 *)((long)pvVar1 + (long)(int)time_end * 0x10 + 8) = 0;
    pthread_create(threads + (long)(int)time_end + -1,(pthread_attr_t *)0x0,thread,
                   (void *)((long)pvVar1 + (long)(int)time_end * 0x10));
  }
  for (local_70 = 0; local_70 < 10; local_70 = local_70 + 1) {
    pthread_join(threads[(long)local_70 + -1],(void **)0x0);
    _i_1 = *(long *)((long)pvVar1 + (long)local_70 * 0x10 + 8) + _i_1;
  }
  clock();
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  return _i_1;
}

Assistant:

long long more_pthr() {
    pthread_t threads[N];
    thr_data* threadData = new thr_data[N];
    long long all_sum = 0;
    for(int i = 0; i < N; i++){
        threadData[i].numberFile = i + 1;
        threadData[i].sum = 0;
        pthread_create(&(threads[i]), NULL, thread, &threadData[i]);
    }
    for(int i = 0; i < N; i++){
        pthread_join(threads[i], NULL);
        all_sum+=threadData[i].sum;
    }
    unsigned int time_end = clock();
    delete[] threadData;
    return all_sum;
}